

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkClearance.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkClearance::ChLinkClearance(ChLinkClearance *this,ChLinkClearance *other)

{
  ChLinkLockLock::ChLinkLockLock(&this->super_ChLinkLockLock,&other->super_ChLinkLockLock);
  (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.super_ChLinkBase.
  super_ChPhysicsItem.super_ChObj._vptr_ChObj = &PTR__ChLinkLockLock_00b42a80;
  (this->contact_F_abs).m_data[0] = 0.0;
  (this->contact_F_abs).m_data[1] = 0.0;
  (this->contact_F_abs).m_data[2] = 0.0;
  (this->contact_V_abs).m_data[0] = 0.0;
  (this->contact_F_abs).m_data[2] = 0.0;
  (this->contact_V_abs).m_data[0] = 0.0;
  (this->contact_V_abs).m_data[1] = 0.0;
  (this->contact_V_abs).m_data[2] = 0.0;
  this->clearance = other->clearance;
  this->c_friction = other->c_friction;
  this->c_restitution = other->c_restitution;
  this->c_tang_restitution = other->c_tang_restitution;
  this->c_viscous = other->c_viscous;
  this->diameter = other->diameter;
  if (other != this) {
    (this->contact_F_abs).m_data[0] = (other->contact_F_abs).m_data[0];
    (this->contact_F_abs).m_data[1] = (other->contact_F_abs).m_data[1];
    (this->contact_F_abs).m_data[2] = (other->contact_F_abs).m_data[2];
    (this->contact_V_abs).m_data[0] = (other->contact_V_abs).m_data[0];
    (this->contact_V_abs).m_data[1] = (other->contact_V_abs).m_data[1];
    (this->contact_V_abs).m_data[2] = (other->contact_V_abs).m_data[2];
  }
  return;
}

Assistant:

ChLinkClearance::ChLinkClearance(const ChLinkClearance& other) : ChLinkLockLock(other) {
    clearance = other.clearance;
    c_friction = other.c_friction;
    c_restitution = other.c_restitution;
    c_tang_restitution = other.c_tang_restitution;
    c_viscous = other.c_viscous;
    diameter = other.diameter;

    contact_F_abs = other.contact_F_abs;
    contact_V_abs = other.contact_V_abs;
}